

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O3

tuple<bool,_bool,_unsigned_int> * __thiscall
spvtools::val::ValidationState_t::EvalInt32IfConst
          (tuple<bool,_bool,_unsigned_int> *__return_storage_ptr__,ValidationState_t *this,
          uint32_t id)

{
  long *plVar1;
  uint32_t uVar2;
  int32_t iVar3;
  const_iterator cVar4;
  uint uVar5;
  bool bVar6;
  undefined1 uVar7;
  uint32_t local_30;
  uint32_t local_2c;
  
  local_30 = id;
  cVar4 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::val::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->all_definitions_)._M_h,&local_30);
  if ((cVar4.
       super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>,_false>
       ._M_cur == (__node_type *)0x0) ||
     (plVar1 = *(long **)((long)cVar4.
                                super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>,_false>
                                ._M_cur + 0x10), plVar1 == (long *)0x0)) {
    __assert_fail("inst",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validation_state.cpp"
                  ,0x591,
                  "std::tuple<bool, bool, uint32_t> spvtools::val::ValidationState_t::EvalInt32IfConst(uint32_t) const"
                 );
  }
  uVar2 = *(uint32_t *)(plVar1 + 8);
  if (((uVar2 == 0) ||
      (local_2c = uVar2,
      cVar4 = std::
              _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::val::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&(this->all_definitions_)._M_h,&local_2c),
      cVar4.
      super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>,_false>.
      _M_cur == (__node_type *)0x0)) ||
     (*(long *)((long)cVar4.
                      super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>,_false>
                      ._M_cur + 0x10) == 0)) {
    uVar5 = 0;
    bVar6 = false;
    uVar7 = 0;
  }
  else {
    uVar5 = 0;
    bVar6 = false;
    uVar7 = 0;
    if (*(short *)(*(long *)((long)cVar4.
                                   super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>,_false>
                                   ._M_cur + 0x10) + 0x3a) == 0x15) {
      uVar2 = GetBitWidth(this,uVar2);
      uVar5 = 0;
      bVar6 = false;
      uVar7 = 0;
      if (uVar2 == 0x20) {
        iVar3 = spvOpcodeIsConstant((uint)*(ushort *)((long)plVar1 + 0x3a));
        uVar7 = 1;
        if (iVar3 != 0) {
          iVar3 = spvOpcodeIsSpecConstant((uint)*(ushort *)((long)plVar1 + 0x3a));
          uVar5 = 0;
          if (iVar3 == 0) {
            bVar6 = true;
            if (*(short *)((long)plVar1 + 0x3a) != 0x2e) {
              if (plVar1[1] - *plVar1 != 0x10) {
                __assert_fail("inst->words().size() == 4",
                              "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validation_state.cpp"
                              ,0x5a3,
                              "std::tuple<bool, bool, uint32_t> spvtools::val::ValidationState_t::EvalInt32IfConst(uint32_t) const"
                             );
              }
              uVar5 = *(uint *)(*plVar1 + 0xc);
            }
            uVar7 = 1;
            goto LAB_003062d9;
          }
        }
        uVar5 = 0;
        bVar6 = false;
      }
    }
  }
LAB_003062d9:
  (__return_storage_ptr__->super__Tuple_impl<0UL,_bool,_bool,_unsigned_int>).
  super__Tuple_impl<1UL,_bool,_unsigned_int>.super__Tuple_impl<2UL,_unsigned_int>.
  super__Head_base<2UL,_unsigned_int,_false>._M_head_impl = uVar5;
  (__return_storage_ptr__->super__Tuple_impl<0UL,_bool,_bool,_unsigned_int>).
  super__Tuple_impl<1UL,_bool,_unsigned_int>.super__Head_base<1UL,_bool,_false>._M_head_impl = bVar6
  ;
  (__return_storage_ptr__->super__Tuple_impl<0UL,_bool,_bool,_unsigned_int>).
  super__Tuple_impl<1UL,_bool,_unsigned_int>.field_0x5 = uVar7;
  return __return_storage_ptr__;
}

Assistant:

std::tuple<bool, bool, uint32_t> ValidationState_t::EvalInt32IfConst(
    uint32_t id) const {
  const Instruction* const inst = FindDef(id);
  assert(inst);
  const uint32_t type = inst->type_id();

  if (type == 0 || !IsIntScalarType(type) || GetBitWidth(type) != 32) {
    return std::make_tuple(false, false, 0);
  }

  // Spec constant values cannot be evaluated so don't consider constant for
  // the purpose of this method.
  if (!spvOpcodeIsConstant(inst->opcode()) ||
      spvOpcodeIsSpecConstant(inst->opcode())) {
    return std::make_tuple(true, false, 0);
  }

  if (inst->opcode() == spv::Op::OpConstantNull) {
    return std::make_tuple(true, true, 0);
  }

  assert(inst->words().size() == 4);
  return std::make_tuple(true, true, inst->word(3));
}